

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

NodePtr __thiscall dh::analysis::var_decl(analysis *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  ostream *poVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  analysis *in_RSI;
  NodePtr NVar7;
  allocator local_1d1;
  string local_1d0 [32];
  undefined1 local_1b0 [8];
  NodePtr tmp_ptr;
  int local_178;
  allocator local_171;
  string local_170 [32];
  undefined1 local_150 [40];
  string local_128 [32];
  undefined1 local_108 [40];
  string local_e0 [32];
  undefined1 local_c0 [40];
  string local_98 [32];
  token local_78;
  int local_44;
  token local_40;
  analysis *this_local;
  NodePtr *ret;
  
  local_40._lineno._3_1_ = 0;
  this_local = this;
  std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &in_RSI->tmp);
  token::getVal_abi_cxx11_(&local_40);
  peVar3 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &in_RSI->tmp);
  local_44 = token::getLineno(peVar3);
  std::make_shared<dh::TreeNode,std::__cxx11::string,int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (int *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &in_RSI->tmp);
  token::getVal_abi_cxx11_(&local_78);
  bVar1 = std::operator==(&local_78._val,"int");
  std::__cxx11::string::~string((string *)&local_78);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"int",(allocator *)(local_c0 + 0x27));
    match(in_RSI,(string *)local_98);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)(local_c0 + 0x27));
    peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    local_c0._32_4_ = 2;
    TreeNode::setType(peVar4,(int *)(local_c0 + 0x20));
  }
  else {
    std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &in_RSI->tmp);
    token::getVal_abi_cxx11_((token *)local_c0);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c0,"boolean");
    std::__cxx11::string::~string((string *)local_c0);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e0,"boolean",(allocator *)(local_108 + 0x27));
      match(in_RSI,(string *)local_e0);
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator((allocator<char> *)(local_108 + 0x27));
      peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      local_108._32_4_ = 0;
      TreeNode::setType(peVar4,(int *)(local_108 + 0x20));
    }
    else {
      std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &in_RSI->tmp);
      token::getVal_abi_cxx11_((token *)local_108);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_108,"float");
      std::__cxx11::string::~string((string *)local_108);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_128,"float",(allocator *)(local_150 + 0x27));
        match(in_RSI,(string *)local_128);
        std::__cxx11::string::~string(local_128);
        std::allocator<char>::~allocator((allocator<char> *)(local_150 + 0x27));
        peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        local_150._32_4_ = 3;
        TreeNode::setType(peVar4,(int *)(local_150 + 0x20));
      }
      else {
        std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   &in_RSI->tmp);
        token::getVal_abi_cxx11_((token *)local_150);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_150,"void");
        std::__cxx11::string::~string((string *)local_150);
        if (!bVar1) {
          poVar5 = std::operator<<((ostream *)&std::cerr,"[ERROR] Unexpected type \"");
          std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     &in_RSI->tmp);
          token::getVal_abi_cxx11_((token *)&stack0xfffffffffffffe68);
          poVar5 = std::operator<<(poVar5,(string *)&stack0xfffffffffffffe68);
          poVar5 = std::operator<<(poVar5,"\" in line ");
          peVar3 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&in_RSI->tmp);
          iVar2 = token::getLineno(peVar3);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
          exit(1);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_170,"void",&local_171);
        match(in_RSI,(string *)local_170);
        std::__cxx11::string::~string(local_170);
        std::allocator<char>::~allocator((allocator<char> *)&local_171);
        peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        local_178 = 4;
        TreeNode::setType(peVar4,&local_178);
      }
    }
  }
  peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
  TreeNode::setNodeKind
            (peVar4,(int *)((long)&tmp_ptr.
                                   super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi + 4));
  peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1;
  TreeNode::setKind(peVar4,(int *)&tmp_ptr.
                                   super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
  init_declarator_list((analysis *)local_1b0);
  peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  TreeNode::appendChild(peVar4,(NodePtr *)local_1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,";",&local_1d1);
  match(in_RSI,(string *)local_1d0);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  local_40._lineno._3_1_ = 1;
  std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)local_1b0);
  _Var6._M_pi = extraout_RDX;
  if ((local_40._lineno._3_1_ & 1) == 0) {
    std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)this);
    _Var6._M_pi = extraout_RDX_00;
  }
  NVar7.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi
  ;
  NVar7.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar7.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::var_decl()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in var_decl\n";
#endif
	NodePtr ret = ::std::make_shared<TreeNode>(tmp->getVal(), tmp->getLineno());
	if ( tmp->getVal() == "int")
	{
		match("int");
		ret->setType(TypeKind::IntK);
	} else if ( tmp->getVal() == "boolean")
	{
		match("boolean");
		ret->setType(TypeKind::BoolK);
	} else if ( tmp->getVal() == "float")
	{
		match("float");
		ret->setType(TypeKind::FloatK);
	} else if ( tmp->getVal() == "void")
	{
		match("void");
		ret->setType(TypeKind::VoidK);
	} else 
	{
		::std::cerr << "[ERROR] Unexpected type \""
			<< tmp->getVal()
			<< "\" in line "
			<< tmp->getLineno()
			<< ::std::endl;
		::std::exit(1);
	}
	ret->setNodeKind(NodeKind::DeclK);
	ret->setKind(DeclKind::VarK);

	NodePtr tmp_ptr = init_declarator_list();
	ret->appendChild(tmp_ptr);

	match(";");

	return ret;
}